

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  ulong *puVar1;
  long *plVar2;
  byte bVar3;
  void *ptr;
  long lVar4;
  int iVar5;
  exr_result_t eVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  uint64_t *freq;
  uint uVar16;
  long lVar17;
  uint uVar18;
  byte *pbVar20;
  _internal_exr_context *pctxt;
  uint uVar21;
  ulong uVar22;
  byte bVar24;
  byte *pbVar25;
  byte *in;
  uint uVar26;
  bool bVar27;
  int iVar28;
  int iVar30;
  double dVar29;
  undefined1 auVar31 [16];
  uint64_t offset [59];
  size_t codeCount [59];
  uint64_t base [59];
  long alStackY_407b8 [180];
  long alStackY_40218 [32576];
  ulong local_7f8;
  ulong local_7b0;
  double local_7a8;
  long alStack_7a0 [59];
  long local_5c8;
  int local_5c0 [118];
  ulong local_3e8 [60];
  ulong local_208 [59];
  ulong uVar19;
  ulong uVar23;
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    pctxt = (_internal_exr_context *)0x0;
  }
  else {
    pctxt = (_internal_exr_context *)decode->context;
  }
  if (nCompressed < 0x14) {
    iVar5 = (uint)(nRaw != 0) * 3;
  }
  else {
    iVar5 = 3;
    if (sparebytes == 0xc0008) {
      uVar12 = *(uint *)compressed;
      uVar11 = (ulong)uVar12;
      uVar14 = *(uint *)(compressed + 4);
      iVar5 = 0x17;
      if (uVar14 < 0x10001 && uVar11 < 0x10001) {
        uVar26 = *(uint *)(compressed + 0xc);
        uVar9 = (ulong)uVar26;
        uVar22 = uVar9 + 7 >> 3;
        if (nCompressed < uVar22 + 0x14) {
          iVar5 = 1;
        }
        else {
          uVar7 = (ulong)uVar14;
          in = compressed + 0x14;
          if (uVar26 < 0x81) {
            pbVar25 = (byte *)(nCompressed - 0x14);
            uVar26 = 0;
            memset(spare,0,0xc0008);
            pbVar20 = in;
            if (uVar12 <= uVar14) {
              uVar22 = 0;
              do {
                if (uVar26 < 6) {
                  if (pbVar25 <= pbVar20 + -(long)in) goto LAB_0010f355;
                  bVar24 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                  uVar22 = uVar22 << 8 | (ulong)bVar24;
                  uVar26 = uVar26 | 8;
                }
                uVar16 = uVar26 - 6;
                uVar18 = (uint)(uVar22 >> ((byte)uVar16 & 0x3f)) & 0x3f;
                uVar19 = (ulong)uVar18;
                *(ulong *)((long)spare + uVar11 * 8) = uVar19;
                if (uVar19 == 0x3f) {
                  if (uVar16 < 8) {
                    if (pbVar25 <= pbVar20 + -(long)in) goto LAB_0010f355;
                    bVar24 = *pbVar20;
                    pbVar20 = pbVar20 + 1;
                    uVar22 = uVar22 << 8 | (ulong)bVar24;
                    uVar16 = uVar26 + 2;
                  }
                  uVar26 = uVar16 - 8;
                  uVar19 = uVar22 >> ((byte)uVar26 & 0x3f) & 0xff;
                  if (uVar7 + 1 < uVar11 + uVar19 + 6) goto LAB_0010f355;
                  lVar8 = uVar19 + 6;
                  uVar19 = uVar11;
                  do {
                    uVar11 = (ulong)((int)uVar19 + 1);
                    *(undefined8 *)((long)spare + uVar19 * 8) = 0;
                    lVar8 = lVar8 + -1;
                    uVar19 = uVar11;
                  } while (lVar8 != 0);
                }
                else {
                  uVar26 = uVar16;
                  if (uVar18 < 0x3b) {
                    uVar11 = (ulong)((int)uVar11 + 1);
                  }
                  else {
                    if (uVar7 + 1 < (uVar11 + uVar19) - 0x39) goto LAB_0010f355;
                    lVar8 = uVar19 - 0x39;
                    uVar19 = uVar11;
                    do {
                      uVar11 = (ulong)((int)uVar19 + 1);
                      *(undefined8 *)((long)spare + uVar19 * 8) = 0;
                      lVar8 = lVar8 + -1;
                      uVar19 = uVar11;
                    } while (lVar8 != 0);
                  }
                }
              } while ((uint)uVar11 <= uVar14);
            }
            pbVar25 = in + ((long)pbVar25 - (long)pbVar20);
            hufCanonicalCodeTable((uint64_t *)spare);
            in = pbVar20;
LAB_0010f355:
            if (uVar9 <= (ulong)((long)pbVar25 << 3)) {
              iVar5 = hufBuildDecTable((uint64_t *)spare,uVar12,uVar14,
                                       (HufDec *)((long)spare + 0x80008));
              if (iVar5 == 0) {
                iVar5 = hufDecode((uint64_t *)spare,(HufDec *)((long)spare + 0x80008),in,uVar9,
                                  uVar14,nRaw,raw);
              }
              lVar8 = 0;
              do {
                ptr = *(void **)((long)spare + lVar8 + 0x80010);
                if (ptr != (void *)0x0) {
                  internal_exr_free(ptr);
                  *(undefined8 *)((long)spare + lVar8 + 0x80010) = 0;
                }
                lVar8 = lVar8 + 0x10;
              } while (lVar8 != 0x40000);
            }
          }
          else {
            *(uint *)spare = uVar14;
            *(undefined4 *)((long)spare + 4) = 0;
            *(undefined2 *)((long)spare + 8) = 0xff;
            uVar16 = 0;
            memset(&local_5c8,0,0x1d8);
            memset(local_208,0xff,0x1d8);
            memset(&local_7a8,0,0x1d8);
            if (uVar14 < uVar12) {
              uVar19 = 0xff;
              local_7f8 = 0;
            }
            else {
              uVar19 = 0xff;
              local_7f8 = 0;
              uVar10 = 0;
              uVar9 = uVar11;
              pbVar20 = in;
              do {
                if (in + ((int)nCompressed + -0x14) <= pbVar20) {
LAB_0010f941:
                  if (pctxt == (_internal_exr_context *)0x0) {
                    return 0x17;
                  }
                  pcVar15 = "Error decoding Huffman table (Truncated table data).";
                  goto LAB_0010f9b1;
                }
                uVar18 = uVar16;
                if ((int)uVar16 < 6) {
                  do {
                    bVar24 = *pbVar20;
                    pbVar20 = pbVar20 + 1;
                    uVar10 = uVar10 << 8 | (ulong)bVar24;
                    uVar18 = uVar16 + 8;
                    bVar27 = (int)uVar16 < -2;
                    uVar16 = uVar18;
                  } while (bVar27);
                }
                uVar16 = uVar18 - 6;
                uVar21 = (uint)(uVar10 >> ((byte)uVar16 & 0x3f)) & 0x3f;
                uVar23 = (ulong)uVar21;
                if (uVar23 < 0x3b) {
                  if (uVar23 != 0) {
                    if (uVar21 < (uint)uVar19) {
                      *(char *)((long)spare + 8) = (char)uVar21;
                      uVar19 = uVar23;
                    }
                    uVar18 = (uint)(byte)local_7f8;
                    if (uVar18 < uVar21) {
                      *(char *)((long)spare + 9) = (char)uVar21;
                      local_7f8 = uVar23;
                    }
                    (&local_5c8)[uVar23] = (&local_5c8)[uVar23] + 1;
                    goto LAB_0010f4c0;
                  }
                }
                else {
                  if (uVar21 == 0x3f) {
                    if (in + ((int)nCompressed + -0x14) <= pbVar20) goto LAB_0010f941;
                    if (uVar16 < 8) {
                      uVar16 = uVar18 + 2;
                      uVar10 = uVar10 << 8 | (ulong)*pbVar20;
                      pbVar20 = pbVar20 + 1;
                    }
                    uVar16 = uVar16 - 8;
                    uVar9 = uVar9 + (uVar10 >> ((byte)uVar16 & 0x3f) & 0xff) + 5;
                  }
                  else {
                    uVar9 = (uVar9 + uVar23) - 0x3a;
                  }
LAB_0010f4c0:
                  if (uVar7 < uVar9) {
                    if (pctxt == (_internal_exr_context *)0x0) {
                      return 0x17;
                    }
                    pcVar15 = "Error decoding Huffman table (Run beyond end of table).";
                    goto LAB_0010f9b1;
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 <= uVar7);
            }
            bVar24 = (byte)uVar19;
            iVar28 = 0;
            iVar30 = 0;
            lVar8 = 0;
            do {
              iVar28 = iVar28 + (int)(&local_5c8)[lVar8];
              iVar30 = iVar30 + local_5c0[lVar8 * 2];
              lVar8 = lVar8 + 2;
            } while (lVar8 != 0x3a);
            *(int *)((long)spare + 4) = iVar30 + iVar28;
            if ((uint)(iVar30 + iVar28) < 0x10002) {
              if (bVar24 <= (byte)local_7f8) {
                local_7b0 = (ulong)((byte)local_7f8 + 1);
                lVar8 = local_7f8 - uVar19;
                uVar9 = uVar19;
                do {
                  lVar13 = (&local_5c8)[uVar9];
                  auVar31._8_4_ = (int)((ulong)lVar13 >> 0x20);
                  auVar31._0_8_ = lVar13;
                  auVar31._12_4_ = 0x45300000;
                  (&local_7a8)[uVar9] =
                       (double)(2L << ((byte)lVar8 & 0x3f)) *
                       ((auVar31._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
                  uVar9 = uVar9 + 1;
                  bVar27 = lVar8 != 0;
                  lVar8 = lVar8 + -1;
                  uVar10 = uVar19;
                } while (bVar27);
                do {
                  dVar29 = 0.0;
                  for (uVar9 = uVar10; uVar9 < local_7f8; uVar9 = uVar9 + 1) {
                    dVar29 = dVar29 + (&local_7a8)[uVar9 + 1];
                  }
                  uVar9 = uVar10 + 1;
                  dVar29 = ceil(dVar29 / (double)(2L << ((byte)local_7f8 - (char)uVar10 & 0x3f)));
                  local_208[uVar10] =
                       (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
                  uVar10 = uVar9;
                } while (uVar9 != local_7b0);
              }
              (&local_7a8)[local_7f8] = 0.0;
              if (bVar24 < (byte)local_7f8) {
                uVar10 = 0;
                uVar9 = local_7f8;
                do {
                  uVar10 = uVar10 + (&local_5c8)[uVar9];
                  (&local_7b0)[uVar9] = uVar10;
                  uVar9 = uVar9 - 1;
                } while ((long)uVar19 < (long)uVar9);
              }
              memset(local_3e8,0xff,0x1d8);
              iVar5 = (int)uVar19;
              if (bVar24 <= (byte)local_7f8) {
                memcpy((void *)((long)local_3e8 + (ulong)(uint)(iVar5 * 8)),
                       (void *)((long)&local_7a8 + (ulong)(uint)(iVar5 * 8)),
                       (ulong)((uint)(byte)local_7f8 - iVar5) * 8 + 8);
              }
              if (uVar12 <= uVar14) {
                uVar12 = 0;
                uVar9 = 0;
                do {
                  uVar14 = uVar12;
                  if ((int)uVar12 < 6) {
                    do {
                      bVar3 = *in;
                      in = in + 1;
                      uVar9 = uVar9 << 8 | (ulong)bVar3;
                      uVar14 = uVar12 + 8;
                      bVar27 = (int)uVar12 < -2;
                      uVar12 = uVar14;
                    } while (bVar27);
                  }
                  uVar12 = uVar14 - 6;
                  uVar16 = (uint)(uVar9 >> ((byte)uVar12 & 0x3f)) & 0x3f;
                  uVar10 = (ulong)uVar16;
                  if (uVar10 < 0x3b) {
                    if (uVar10 != 0) {
                      uVar23 = local_208[uVar10 - 0x3c];
                      if ((ulong)(long)*(int *)((long)spare + 4) <= uVar23) {
                        if (pctxt == (_internal_exr_context *)0x0) {
                          return 0x17;
                        }
                        pcVar15 = "Huffman decode error (Invalid symbol in header)";
                        goto LAB_0010f9b1;
                      }
                      *(int *)((long)spare + uVar23 * 4 + 0xc) = (int)uVar11;
                      local_208[uVar10 - 0x3c] = uVar23 + 1;
                    }
                  }
                  else if (uVar16 == 0x3f) {
                    if (uVar12 < 8) {
                      uVar12 = uVar14 + 2;
                      uVar9 = uVar9 << 8 | (ulong)*in;
                      in = in + 1;
                    }
                    uVar12 = uVar12 - 8;
                    uVar11 = uVar11 + (uVar9 >> ((byte)uVar12 & 0x3f) & 0xff) + 5;
                  }
                  else {
                    uVar11 = (uVar11 + uVar10) - 0x3a;
                  }
                  bVar27 = uVar11 < uVar7;
                  uVar11 = uVar11 + 1;
                } while (bVar27);
              }
              lVar13 = 0x40;
              lVar8 = 0x40010;
              do {
                lVar17 = *(long *)((long)alStackY_40218 + lVar8) << ((byte)lVar13 & 0x3f);
                if (*(long *)((long)alStackY_40218 + lVar8) == -1) {
                  lVar17 = -1;
                }
                *(long *)((long)spare + lVar8) = lVar17;
                lVar13 = lVar13 + -1;
                lVar8 = lVar8 + 8;
              } while (lVar13 != 5);
              *(undefined8 *)((long)spare + 0x401e8) = 0;
              *(long *)((long)spare + 0x401f0) = (long)local_7a8 - *(long *)((long)spare + 0x40010);
              lVar13 = 1;
              lVar17 = 2;
              lVar8 = 0x8003;
              do {
                lVar4 = alStackY_407b8[lVar8 + 1];
                puVar1 = (ulong *)((long)spare + lVar8 * 8);
                uVar11 = puVar1[1];
                plVar2 = (long *)((long)spare + lVar8 * 8 + 0x1e0);
                *plVar2 = alStackY_407b8[lVar8] - (*puVar1 >> 0x40 - lVar13);
                plVar2[1] = lVar4 - (uVar11 >> 0x40 - lVar17);
                lVar13 = lVar13 + 2;
                lVar17 = lVar17 + 2;
                lVar8 = lVar8 + 2;
              } while (lVar8 != 0x803d);
              bVar27 = false;
              uVar11 = 0;
              do {
                *(undefined4 *)((long)spare + uVar11 * 4 + 0x403c8) = 0xffff;
                if (bVar24 <= (byte)local_7f8) {
                  lVar8 = uVar19 - 0x40;
                  uVar12 = iVar5 << 0x18;
                  do {
                    if (*(ulong *)((long)spare + lVar8 * 8 + 0x40210) <= uVar11 << 0x32) {
                      uVar9 = ((uVar11 << 0x32) >> (-(char)lVar8 & 0x3fU)) +
                              *(long *)((long)spare + lVar8 * 8 + 0x403f0);
                      if ((ulong)(long)*(int *)((long)spare + 4) <= uVar9) {
                        if (pctxt != (_internal_exr_context *)0x0) {
                          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Overrun)");
                        }
                        if (!bVar27) {
                          return 0x17;
                        }
                        goto LAB_0010f8ce;
                      }
                      *(uint *)((long)spare + uVar11 * 4 + 0x403c8) =
                           uVar12 | *(uint *)((long)spare + uVar9 * 4 + 0xc);
                      break;
                    }
                    uVar12 = uVar12 + 0x1000000;
                    lVar13 = lVar8 - local_7f8;
                    lVar8 = lVar8 + 1;
                  } while (lVar13 != -0x40);
                }
                bVar27 = 0x3ffe < uVar11;
                uVar11 = uVar11 + 1;
              } while (uVar11 != 0x4000);
LAB_0010f8ce:
              uVar11 = 0xf;
              do {
                uVar12 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar12;
                lVar8 = *(long *)((long)spare + uVar11 * 8 + 0x40010);
                if (lVar8 != -1) goto LAB_0010f8fe;
              } while (1 < uVar12);
              lVar8 = *(long *)((long)spare + 0x40010);
LAB_0010f8fe:
              *(long *)((long)spare + 0x503c8) = lVar8;
              iVar5 = 1;
              if (in + (uVar22 - (long)compressed) <= nCompressed) {
                eVar6 = fasthuf_decode(pctxt,(FastHufDecoder *)spare,in,uVar26,raw,(int)nRaw);
                return eVar6;
              }
            }
            else if (pctxt != (_internal_exr_context *)0x0) {
              pcVar15 = "Error decoding Huffman table (Too many symbols).";
LAB_0010f9b1:
              iVar5 = 0x17;
              (*pctxt->print_error)(pctxt,0x17,pcVar15);
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t                            im, iM, nBits;
    uint64_t                            nBytes;
    const uint8_t*                      ptr;
    exr_result_t                        rv;
    const struct _internal_exr_context* pctxt = NULL;
    const uint64_t hufInfoBlockSize           = 5 * sizeof (uint32_t);

    if (decode) pctxt = EXR_CCTXT (decode->context);
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (pctxt, fhd, &ptr, (int) (nCompressed - hufInfoBlockSize), im, iM, iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ( (uint64_t)(ptr - compressed) + nBytes > nCompressed )
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, (int) nRaw);
        }
    }
    else
    {
        uint64_t* freq     = (uint64_t*) spare;
        HufDec*   hdec     = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft    = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (hdec);
    }
    return rv;
}